

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O2

bool __thiscall QBitArray::fill(QBitArray *this,bool aval,qsizetype asize)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (asize < 0) {
    pcVar3 = (this->d).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    asize = (this->d).d.size * 8 - (long)*pcVar3;
  }
  QBitArray::QBitArray((QBitArray *)&local_38,asize,aval);
  pDVar2 = (this->d).d.d;
  pcVar3 = (this->d).d.ptr;
  (this->d).d.d = local_38.d;
  (this->d).d.ptr = local_38.ptr;
  qVar1 = (this->d).d.size;
  (this->d).d.size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool fill(bool aval, qsizetype asize = -1)
    { *this = QBitArray((asize < 0 ? this->size() : asize), aval); return true; }